

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

char * __thiscall leveldb::Arena::AllocateNewBlock(Arena *this,size_t block_bytes)

{
  long in_FS_OFFSET;
  char *result;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (char *)operator_new__(block_bytes);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->blocks_,&local_28);
  LOCK();
  (this->memory_usage_).super___atomic_base<unsigned_long>._M_i =
       (this->memory_usage_).super___atomic_base<unsigned_long>._M_i + block_bytes + 8;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

char* Arena::AllocateNewBlock(size_t block_bytes) {
  char* result = new char[block_bytes];
  blocks_.push_back(result);
  memory_usage_.fetch_add(block_bytes + sizeof(char*),
                          std::memory_order_relaxed);
  return result;
}